

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bio_prov.c
# Opt level: O0

BIO_METHOD * ossl_bio_prov_init_bio_method(void)

{
  int iVar1;
  BIO_METHOD *biom;
  BIO_METHOD *corebiometh;
  undefined8 in_stack_fffffffffffffff8;
  
  biom = BIO_meth_new((int)((ulong)in_stack_fffffffffffffff8 >> 0x20),(char *)0x0);
  if (((((biom == (BIO_METHOD *)0x0) ||
        (iVar1 = BIO_meth_set_write_ex(biom,bio_core_write_ex), iVar1 == 0)) ||
       (iVar1 = BIO_meth_set_read_ex(biom,bio_core_read_ex), iVar1 == 0)) ||
      ((iVar1 = BIO_meth_set_puts(biom,bio_core_puts), iVar1 == 0 ||
       (iVar1 = BIO_meth_set_gets(biom,bio_core_gets), iVar1 == 0)))) ||
     ((iVar1 = BIO_meth_set_ctrl(biom,bio_core_ctrl), iVar1 == 0 ||
      ((iVar1 = BIO_meth_set_create(biom,bio_core_new), iVar1 == 0 ||
       (iVar1 = BIO_meth_set_destroy(biom,bio_core_free), iVar1 == 0)))))) {
    BIO_meth_free((BIO_METHOD *)0x2e7cc7);
    biom = (BIO_METHOD *)0x0;
  }
  return biom;
}

Assistant:

BIO_METHOD *ossl_bio_prov_init_bio_method(void)
{
    BIO_METHOD *corebiometh = NULL;

    corebiometh = BIO_meth_new(BIO_TYPE_CORE_TO_PROV, "BIO to Core filter");
    if (corebiometh == NULL
            || !BIO_meth_set_write_ex(corebiometh, bio_core_write_ex)
            || !BIO_meth_set_read_ex(corebiometh, bio_core_read_ex)
            || !BIO_meth_set_puts(corebiometh, bio_core_puts)
            || !BIO_meth_set_gets(corebiometh, bio_core_gets)
            || !BIO_meth_set_ctrl(corebiometh, bio_core_ctrl)
            || !BIO_meth_set_create(corebiometh, bio_core_new)
            || !BIO_meth_set_destroy(corebiometh, bio_core_free)) {
        BIO_meth_free(corebiometh);
        return NULL;
    }

    return corebiometh;
}